

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O1

void __thiscall
tetgenmesh::lu_solve(tetgenmesh *this,double (*lu) [4],int n,int *ps,double *b,int N)

{
  int iVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  int iVar7;
  long lVar8;
  double dVar9;
  double X [4];
  double adStack_58 [5];
  
  iVar7 = N + n;
  lVar8 = (long)N;
  if (0 < n) {
    iVar1 = N + 1;
    if (N + 1 < iVar7) {
      iVar1 = iVar7;
    }
    memset(adStack_58 + lVar8,0,(ulong)(uint)(iVar1 + ~N) * 8 + 8);
  }
  lVar2 = (long)iVar7;
  lVar3 = lVar8;
  if (0 < n) {
    do {
      if (lVar3 < 1) {
        dVar9 = 0.0;
      }
      else {
        dVar9 = 0.0;
        lVar4 = lVar8;
        do {
          dVar9 = dVar9 + lu[ps[lVar3]][lVar4] * adStack_58[lVar4];
          lVar4 = lVar4 + 1;
        } while (lVar4 < lVar3 + lVar8);
      }
      adStack_58[lVar3] = b[ps[lVar3]] - dVar9;
      lVar3 = lVar3 + 1;
    } while (lVar3 < lVar2);
  }
  if (0 < n) {
    lVar4 = 0;
    lVar3 = lVar2;
    do {
      lVar5 = lVar3 + -1;
      dVar9 = 0.0;
      if (lVar3 < lVar2) {
        lVar6 = lVar4;
        do {
          dVar9 = dVar9 + lu[ps[lVar5]][lVar2 + lVar6] * adStack_58[lVar2 + lVar6];
          lVar6 = lVar6 + 1;
        } while ((int)lVar6 != 0);
      }
      adStack_58[lVar5] = (adStack_58[lVar5] - dVar9) / lu[(long)ps[lVar5] + -1][lVar3 + 3];
      lVar4 = lVar4 + -1;
      lVar3 = lVar5;
    } while (lVar8 < lVar5);
  }
  if (0 < n) {
    iVar1 = N + 1;
    if (N + 1 < iVar7) {
      iVar1 = iVar7;
    }
    memcpy(b + lVar8,adStack_58 + lVar8,(ulong)(uint)(iVar1 + ~N) * 8 + 8);
  }
  return;
}

Assistant:

void tetgenmesh::lu_solve(REAL lu[4][4], int n, int* ps, REAL* b, int N)
{
  int i, j;
  REAL X[4], dot;

  for (i = N; i < n + N; i++) X[i] = 0.0;

  // Vector reduction using U triangular matrix.
  for (i = N; i < n + N; i++) {
    dot = 0.0;
    for (j = N; j < i + N; j++)
      dot += lu[ps[i]][j] * X[j];
    X[i] = b[ps[i]] - dot;
  }

  // Back substitution, in L triangular matrix.
  for (i = n + N - 1; i >= N; i--) {
    dot = 0.0;
    for (j = i + 1; j < n + N; j++)
      dot += lu[ps[i]][j] * X[j];
    X[i] = (X[i] - dot) / lu[ps[i]][i];
  }

  for (i = N; i < n + N; i++) b[i] = X[i];
}